

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeMerging.cpp
# Opt level: O0

Pass * wasm::createTypeMergingPass(void)

{
  TypeMerging *this;
  
  this = (TypeMerging *)operator_new(0x150);
  memset(this,0,0x150);
  anon_unknown_0::TypeMerging::TypeMerging(this);
  return &this->super_Pass;
}

Assistant:

Pass* createTypeMergingPass() { return new TypeMerging(); }